

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

void __thiscall Json::StyledWriter::~StyledWriter(StyledWriter *this)

{
  ~StyledWriter(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

~StyledWriter() override = default;